

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O0

nvpair_t * nvpair_allocv(char *name,int type,uint64_t data,size_t datasize,size_t nitems)

{
  size_t __n;
  int *piVar1;
  size_t namelen;
  nvpair_t *nvp;
  size_t nitems_local;
  size_t datasize_local;
  uint64_t data_local;
  int type_local;
  char *name_local;
  
  if ((0 < type) && (type < 0xd)) {
    __n = strlen(name);
    if (__n < 0x800) {
      name_local = (char *)calloc(1,__n + 0x49);
      if (name_local != (char *)0x0) {
        *(char **)(name_local + 8) = name_local + 0x48;
        memcpy(*(void **)(name_local + 8),name,__n);
        *(undefined1 *)(*(long *)(name_local + 8) + __n) = 0;
        *(int *)(name_local + 0x10) = type;
        *(uint64_t *)(name_local + 0x18) = data;
        *(size_t *)(name_local + 0x20) = datasize;
        *(size_t *)(name_local + 0x28) = nitems;
        name_local[0] = 'p';
        name_local[1] = 'v';
        name_local[2] = 'n';
        name_local[3] = '\0';
      }
    }
    else {
      piVar1 = __errno_location();
      *piVar1 = 0x24;
      name_local = (char *)0x0;
    }
    return (nvpair_t *)name_local;
  }
  __assert_fail("type >= 1 && type <= 12",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                ,0x72,"nvpair_t *nvpair_allocv(const char *, int, uint64_t, size_t, size_t)");
}

Assistant:

static nvpair_t *
nvpair_allocv(const char *name, int type, uint64_t data, size_t datasize,
    size_t nitems)
{
	nvpair_t *nvp;
	size_t namelen;

	PJDLOG_ASSERT(type >= NV_TYPE_FIRST && type <= NV_TYPE_LAST);

	namelen = strlen(name);
	if (namelen >= NV_NAME_MAX) {
		ERRNO_SET(ENAMETOOLONG);
		return (NULL);
	}

	nvp = nv_calloc(1, sizeof(*nvp) + namelen + 1);
	if (nvp != NULL) {
		nvp->nvp_name = (char *)(nvp + 1);
		memcpy(nvp->nvp_name, name, namelen);
		nvp->nvp_name[namelen] = '\0';
		nvp->nvp_type = type;
		nvp->nvp_data = data;
		nvp->nvp_datasize = datasize;
		nvp->nvp_nitems = nitems;
		nvp->nvp_magic = NVPAIR_MAGIC;
	}

	return (nvp);
}